

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O1

xmlChar * xmlCatalogUnWrapURN(xmlChar *urn)

{
  int iVar1;
  uint uVar2;
  xmlChar *pxVar3;
  byte *pbVar4;
  ulong uVar5;
  byte bVar6;
  ulong uVar7;
  byte bVar8;
  xmlChar result [2000];
  byte local_7d8 [2000];
  
  iVar1 = xmlStrncmp(urn,(xmlChar *)"urn:publicid:",0xd);
  if (iVar1 == 0) {
    bVar6 = urn[0xd];
    uVar2 = 0;
    if (bVar6 == 0) {
      uVar5 = 0;
    }
    else {
      pbVar4 = urn + 0xd;
      uVar5 = 0;
      do {
        if (bVar6 < 0x3a) {
          if (bVar6 != 0x25) {
            if (bVar6 == 0x2b) {
              uVar2 = uVar2 + 1;
              local_7d8[uVar5] = 0x20;
            }
            else {
LAB_00164198:
              uVar2 = uVar2 + 1;
              local_7d8[uVar5] = bVar6;
            }
            goto LAB_0016422a;
          }
          bVar6 = pbVar4[1];
          if ((((((bVar6 == 0x32) && (bVar8 = 0x2b, pbVar4[2] == 0x42)) ||
                ((bVar6 == 0x33 && (bVar8 = 0x3a, pbVar4[2] == 0x41)))) ||
               ((bVar6 == 0x32 && (bVar8 = 0x2f, pbVar4[2] == 0x46)))) ||
              ((bVar6 == 0x33 && (bVar8 = 0x3b, pbVar4[2] == 0x42)))) ||
             ((((bVar6 == 0x32 && (bVar8 = 0x27, pbVar4[2] == 0x37)) ||
               ((bVar6 == 0x33 && (bVar8 = 0x3f, pbVar4[2] == 0x46)))) ||
              ((bVar6 == 0x32 &&
               ((bVar8 = 0x23, pbVar4[2] == 0x33 || (bVar8 = 0x25, pbVar4[2] == 0x35)))))))) {
            local_7d8[uVar5] = bVar8;
            uVar2 = uVar2 + 1;
            pbVar4 = pbVar4 + 3;
          }
          else {
            pbVar4 = pbVar4 + 1;
            uVar2 = uVar2 + 1;
            local_7d8[uVar5] = 0x25;
          }
        }
        else {
          if (bVar6 == 0x3a) {
            uVar7 = (ulong)uVar2;
            local_7d8[uVar5] = 0x2f;
            uVar2 = uVar2 + 2;
            local_7d8[uVar7 + 1] = 0x2f;
          }
          else {
            if (bVar6 != 0x3b) goto LAB_00164198;
            uVar7 = (ulong)uVar2;
            local_7d8[uVar5] = 0x3a;
            uVar2 = uVar2 + 2;
            local_7d8[uVar7 + 1] = 0x3a;
          }
LAB_0016422a:
          pbVar4 = pbVar4 + 1;
        }
        bVar6 = *pbVar4;
        uVar5 = (ulong)uVar2;
      } while ((bVar6 != 0) && (uVar2 < 0x7cd));
    }
    local_7d8[uVar5] = 0;
    pxVar3 = xmlStrdup(local_7d8);
  }
  else {
    pxVar3 = (xmlChar *)0x0;
  }
  return pxVar3;
}

Assistant:

static xmlChar *
xmlCatalogUnWrapURN(const xmlChar *urn) {
    xmlChar result[2000];
    unsigned int i = 0;

    if (xmlStrncmp(urn, BAD_CAST XML_URN_PUBID, sizeof(XML_URN_PUBID) - 1))
	return(NULL);
    urn += sizeof(XML_URN_PUBID) - 1;

    while (*urn != 0) {
	if (i > sizeof(result) - 4)
	    break;
	if (*urn == '+') {
	    result[i++] = ' ';
	    urn++;
	} else if (*urn == ':') {
	    result[i++] = '/';
	    result[i++] = '/';
	    urn++;
	} else if (*urn == ';') {
	    result[i++] = ':';
	    result[i++] = ':';
	    urn++;
	} else if (*urn == '%') {
	    if ((urn[1] == '2') && (urn[2] == 'B'))
		result[i++] = '+';
	    else if ((urn[1] == '3') && (urn[2] == 'A'))
		result[i++] = ':';
	    else if ((urn[1] == '2') && (urn[2] == 'F'))
		result[i++] = '/';
	    else if ((urn[1] == '3') && (urn[2] == 'B'))
		result[i++] = ';';
	    else if ((urn[1] == '2') && (urn[2] == '7'))
		result[i++] = '\'';
	    else if ((urn[1] == '3') && (urn[2] == 'F'))
		result[i++] = '?';
	    else if ((urn[1] == '2') && (urn[2] == '3'))
		result[i++] = '#';
	    else if ((urn[1] == '2') && (urn[2] == '5'))
		result[i++] = '%';
	    else {
		result[i++] = *urn;
		urn++;
		continue;
	    }
	    urn += 3;
	} else {
	    result[i++] = *urn;
	    urn++;
	}
    }
    result[i] = 0;

    return(xmlStrdup(result));
}